

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkset_tpl.h
# Opt level: O2

uint8_t * chunkmemset_safe_sse2(uint8_t *out,uint8_t *from,uint len,uint left)

{
  uint len_00;
  uint8_t *puVar1;
  long lVar2;
  
  len_00 = left;
  if (len < left) {
    len_00 = len;
  }
  if (left < 0x10) {
    if (left < len) {
      len = left;
    }
    for (lVar2 = 0; len != (uint)lVar2; lVar2 = lVar2 + 1) {
      out[lVar2] = from[lVar2];
    }
    out = out + lVar2;
  }
  else if (len != 0) {
    puVar1 = chunkmemset_sse2(out,from,len_00);
    return puVar1;
  }
  return out;
}

Assistant:

Z_INTERNAL uint8_t* CHUNKMEMSET_SAFE(uint8_t *out, uint8_t *from, unsigned len, unsigned left) {
#if OPTIMAL_CMP < 32
    static const uint32_t align_mask = 7;
#elif OPTIMAL_CMP == 32
    static const uint32_t align_mask = 3;
#endif

    len = MIN(len, left);

#if OPTIMAL_CMP < 64
    while (((uintptr_t)out & align_mask) && (len > 0)) {
        *out++ = *from++;
        --len;
        --left;
    }
#endif

#ifndef HAVE_MASKED_READWRITE
    if (UNLIKELY(left < sizeof(chunk_t))) {
        while (len > 0) {
            *out++ = *from++;
            --len;
        }

        return out;
    }
#endif

    if (len)
        out = CHUNKMEMSET(out, from, len);

    return out;
}